

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_grp.c
# Opt level: O2

void * GRP_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  PHYSFS_ErrorCode errcode;
  int iVar1;
  void *opaque;
  char *pcVar2;
  void *pvVar3;
  PHYSFS_uint32 PVar4;
  uint uVar5;
  bool bVar6;
  PHYSFS_uint32 count;
  PHYSFS_uint32 local_50;
  PHYSFS_uint8 buf [12];
  char name_1 [13];
  
  count = 0;
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/REGoth-project[P]physfs/src/physfs_archiver_grp.c"
                  ,0x42,"void *GRP_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar1 = __PHYSFS_readAll(io,buf,0xc);
    if (iVar1 == 0) {
      return (void *)0x0;
    }
    iVar1 = bcmp(buf,"KenSilverman",0xc);
    if (iVar1 == 0) {
      *claimed = 1;
      iVar1 = __PHYSFS_readAll(io,&count,4);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      count = PHYSFS_swapULE32(count);
      opaque = UNPK_openArchive(io);
      if (opaque == (void *)0x0) {
        return (void *)0x0;
      }
      uVar5 = count * 0x10 + 0x10;
      PVar4 = count;
      while( true ) {
        bVar6 = PVar4 == 0;
        PVar4 = PVar4 - 1;
        if (bVar6) {
          return opaque;
        }
        iVar1 = __PHYSFS_readAll(io,name_1,0xc);
        if ((iVar1 == 0) || (iVar1 = __PHYSFS_readAll(io,&local_50,4), iVar1 == 0)) break;
        name_1[0xc] = '\0';
        pcVar2 = strchr(name_1,0x20);
        if (pcVar2 != (char *)0x0) {
          *pcVar2 = '\0';
        }
        local_50 = PHYSFS_swapULE32(local_50);
        pvVar3 = UNPK_addEntry(opaque,name_1,0,-1,-1,(ulong)uVar5,(ulong)local_50);
        if (pvVar3 == (void *)0x0) break;
        uVar5 = uVar5 + local_50;
      }
      UNPK_abandonArchive(opaque);
      return (void *)0x0;
    }
    errcode = PHYSFS_ERR_UNSUPPORTED;
  }
  else {
    errcode = PHYSFS_ERR_READ_ONLY;
  }
  PHYSFS_setErrorCode(errcode);
  return (void *)0x0;
}

Assistant:

static void *GRP_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_uint8 buf[12];
    PHYSFS_uint32 count = 0;
    void *unpkarc = NULL;

    assert(io != NULL);  /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, buf, sizeof (buf)), NULL);
    if (memcmp(buf, "KenSilverman", sizeof (buf)) != 0)
        BAIL(PHYSFS_ERR_UNSUPPORTED, NULL);

    *claimed = 1;

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &count, sizeof(count)), NULL);
    count = PHYSFS_swapULE32(count);

    unpkarc = UNPK_openArchive(io);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!grpLoadEntries(io, count, unpkarc))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    return unpkarc;
}